

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigScl.c
# Opt level: O0

int Aig_ManSeqCleanup(Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Aig_Obj_t *pAVar7;
  Vec_Ptr_t *p_00;
  void *Entry;
  Aig_Obj_t *pAVar8;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  int local_58;
  int k;
  int iNum;
  int nTruePos_1;
  int nTruePos;
  int nTruePis;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vCos;
  Vec_Ptr_t *vCis;
  Vec_Ptr_t *vNodes;
  Aig_Man_t *p_local;
  
  Aig_ManIncrementTravId(p);
  pAVar7 = Aig_ManConst1(p);
  Aig_ObjSetTravIdCurrent(p,pAVar7);
  nTruePos = 0;
  while( true ) {
    iVar1 = Aig_ManCiNum(p);
    iVar2 = Aig_ManRegNum(p);
    if (iVar1 - iVar2 <= nTruePos) break;
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,nTruePos);
    Aig_ObjSetTravIdCurrent(p,pAVar7);
    nTruePos = nTruePos + 1;
  }
  p_00 = Vec_PtrAlloc(100);
  nTruePos = 0;
  while( true ) {
    iVar1 = Aig_ManCoNum(p);
    iVar2 = Aig_ManRegNum(p);
    if (iVar1 - iVar2 <= nTruePos) break;
    Entry = Vec_PtrEntry(p->vCos,nTruePos);
    Vec_PtrPush(p_00,Entry);
    nTruePos = nTruePos + 1;
  }
  for (nTruePos = 0; iVar1 = Aig_ManRegNum(p), nTruePos < iVar1; nTruePos = nTruePos + 1) {
    pAVar7 = Aig_ManLi(p,nTruePos);
    pAVar8 = Aig_ManLo(p,nTruePos);
    (pAVar8->field_0).pNext = pAVar7;
  }
  for (nTruePos = 0; iVar1 = Vec_PtrSize(p_00), nTruePos < iVar1; nTruePos = nTruePos + 1) {
    pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p_00,nTruePos);
    Aig_ManSeqCleanup_rec(p,pAVar7,p_00);
  }
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Aig_ManCoNum(p);
  if (iVar2 < iVar1) {
    __assert_fail("Vec_PtrSize(vNodes) <= Aig_ManCoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                  ,0xb6,"int Aig_ManSeqCleanup(Aig_Man_t *)");
  }
  for (nTruePos = 0; iVar1 = Aig_ManRegNum(p), nTruePos < iVar1; nTruePos = nTruePos + 1) {
    Aig_ManLi(p,nTruePos);
    pAVar7 = Aig_ManLo(p,nTruePos);
    (pAVar7->field_0).pNext = (Aig_Obj_t *)0x0;
  }
  iVar1 = Vec_PtrSize(p_00);
  iVar2 = Aig_ManCoNum(p);
  if (iVar1 < iVar2) {
    if (p->vFlopNums != (Vec_Int_t *)0x0) {
      iVar2 = Aig_ManCoNum(p);
      iVar1 = Aig_ManRegNum(p);
      iVar2 = iVar2 - iVar1;
      local_58 = 0;
      for (nTruePos = 0; iVar1 = Vec_PtrSize(p->vCos), nTruePos < iVar1; nTruePos = nTruePos + 1) {
        pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nTruePos);
        if ((iVar2 <= nTruePos) && (iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar7), iVar1 != 0)) {
          iVar1 = Vec_IntEntry(p->vFlopNums,nTruePos - iVar2);
          Vec_IntWriteEntry(p->vFlopNums,local_58,iVar1);
          local_58 = local_58 + 1;
        }
      }
      iVar1 = Vec_PtrSize(p_00);
      if (local_58 != iVar1 - iVar2) {
        __assert_fail("k == Vec_PtrSize(vNodes) - nTruePos",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                      ,200,"int Aig_ManSeqCleanup(Aig_Man_t *)");
      }
      Vec_IntShrink(p->vFlopNums,local_58);
    }
    iVar1 = Aig_ManCiNum(p);
    p_01 = Vec_PtrAlloc(iVar1);
    for (nTruePos = 0; iVar1 = Vec_PtrSize(p->vCis), nTruePos < iVar1; nTruePos = nTruePos + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,nTruePos);
      iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar7);
      if (iVar1 == 0) {
        Vec_PtrWriteEntry(p->vObjs,pAVar7->Id,(void *)0x0);
      }
      else {
        Vec_PtrPush(p_01,pAVar7);
      }
    }
    iVar1 = Aig_ManCoNum(p);
    p_02 = Vec_PtrAlloc(iVar1);
    for (nTruePos = 0; iVar1 = Vec_PtrSize(p->vCos), nTruePos < iVar1; nTruePos = nTruePos + 1) {
      pAVar7 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,nTruePos);
      iVar1 = Aig_ObjIsTravIdCurrent(p,pAVar7);
      if (iVar1 == 0) {
        Aig_ObjDisconnect(p,pAVar7);
        Vec_PtrWriteEntry(p->vObjs,pAVar7->Id,(void *)0x0);
      }
      else {
        Vec_PtrPush(p_02,pAVar7);
      }
    }
    iVar1 = Aig_ManCiNum(p);
    iVar2 = Aig_ManRegNum(p);
    iVar3 = Aig_ManCoNum(p);
    iVar4 = Aig_ManRegNum(p);
    iVar5 = Aig_ManCoNum(p);
    iVar6 = Vec_PtrSize(p_00);
    p->nRegs = p->nRegs - (iVar5 - iVar6);
    iVar5 = Vec_PtrSize(p_01);
    if (iVar5 != (iVar1 - iVar2) + p->nRegs) {
      __assert_fail("Vec_PtrSize(vCis) == nTruePis + p->nRegs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                    ,0xe5,"int Aig_ManSeqCleanup(Aig_Man_t *)");
    }
    iVar1 = Vec_PtrSize(p_02);
    if (iVar1 != (iVar3 - iVar4) + p->nRegs) {
      __assert_fail("Vec_PtrSize(vCos) == nTruePos + p->nRegs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigScl.c"
                    ,0xe6,"int Aig_ManSeqCleanup(Aig_Man_t *)");
    }
    Vec_PtrFree(p->vCis);
    p->vCis = p_01;
    Vec_PtrFree(p->vCos);
    p->vCos = p_02;
    iVar1 = Vec_PtrSize(p->vCis);
    p->nObjs[2] = iVar1;
    iVar1 = Vec_PtrSize(p->vCos);
    p->nObjs[3] = iVar1;
  }
  Vec_PtrFree(p_00);
  iVar1 = Aig_ManCiNum(p);
  iVar2 = Aig_ManRegNum(p);
  p->nTruePis = iVar1 - iVar2;
  iVar1 = Aig_ManCoNum(p);
  iVar2 = Aig_ManRegNum(p);
  p->nTruePos = iVar1 - iVar2;
  Aig_ManSetCioIds(p);
  iVar1 = Aig_ManCleanup(p);
  return iVar1;
}

Assistant:

int Aig_ManSeqCleanup( Aig_Man_t * p )
{
    Vec_Ptr_t * vNodes, * vCis, * vCos;
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i, nTruePis, nTruePos;
//    assert( Aig_ManBufNum(p) == 0 );

    // mark the PIs
    Aig_ManIncrementTravId( p );
    Aig_ObjSetTravIdCurrent( p, Aig_ManConst1(p) );
    Aig_ManForEachPiSeq( p, pObj, i )
        Aig_ObjSetTravIdCurrent( p, pObj );

    // prepare to collect nodes reachable from POs
    vNodes = Vec_PtrAlloc( 100 );
    Aig_ManForEachPoSeq( p, pObj, i )
        Vec_PtrPush( vNodes, pObj );

    // remember latch inputs in latch outputs
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = pObjLi;
    // mark the nodes reachable from these nodes
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Aig_ManSeqCleanup_rec( p, pObj, vNodes );
    assert( Vec_PtrSize(vNodes) <= Aig_ManCoNum(p) );
    // clean latch output pointers
    Aig_ManForEachLiLoSeq( p, pObjLi, pObjLo, i )
        pObjLo->pNext = NULL;

    // if some latches are removed, update PIs/POs
    if ( Vec_PtrSize(vNodes) < Aig_ManCoNum(p) )
    {
        if ( p->vFlopNums )
        {
            int nTruePos = Aig_ManCoNum(p)-Aig_ManRegNum(p);
            int iNum, k = 0;
            Aig_ManForEachCo( p, pObj, i )
                if ( i >= nTruePos && Aig_ObjIsTravIdCurrent(p, pObj) )
                {
                    iNum = Vec_IntEntry( p->vFlopNums, i - nTruePos );
                    Vec_IntWriteEntry( p->vFlopNums, k++, iNum );
                }
            assert( k == Vec_PtrSize(vNodes) - nTruePos );
            Vec_IntShrink( p->vFlopNums, k );
        }
        // collect new CIs/COs
        vCis = Vec_PtrAlloc( Aig_ManCiNum(p) );
        Aig_ManForEachCi( p, pObj, i )
            if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                Vec_PtrPush( vCis, pObj );
            else
            {
                Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
//                Aig_ManRecycleMemory( p, pObj );
            }
        vCos = Vec_PtrAlloc( Aig_ManCoNum(p) );
        Aig_ManForEachCo( p, pObj, i )
            if ( Aig_ObjIsTravIdCurrent(p, pObj) )
                Vec_PtrPush( vCos, pObj );
            else
            {
                Aig_ObjDisconnect( p, pObj );
                Vec_PtrWriteEntry( p->vObjs, pObj->Id, NULL );
//                Aig_ManRecycleMemory( p, pObj );
            }
        // remember the number of true PIs/POs
        nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p);
        nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p);
        // set the new number of registers
        p->nRegs -= Aig_ManCoNum(p) - Vec_PtrSize(vNodes);
        // create new PIs/POs
        assert( Vec_PtrSize(vCis) == nTruePis + p->nRegs );
        assert( Vec_PtrSize(vCos) == nTruePos + p->nRegs );
        Vec_PtrFree( p->vCis );    p->vCis = vCis;
        Vec_PtrFree( p->vCos );    p->vCos = vCos;
        p->nObjs[AIG_OBJ_CI] = Vec_PtrSize( p->vCis );
        p->nObjs[AIG_OBJ_CO] = Vec_PtrSize( p->vCos );
                
    }
    Vec_PtrFree( vNodes );
    p->nTruePis = Aig_ManCiNum(p) - Aig_ManRegNum(p); 
    p->nTruePos = Aig_ManCoNum(p) - Aig_ManRegNum(p); 
    Aig_ManSetCioIds( p );
    // remove dangling nodes
    return Aig_ManCleanup( p );
}